

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUnreach.c
# Opt level: O0

DdNode * Abc_NtkComputeUnreachable
                   (DdManager *dd,Abc_Ntk_t *pNtk,DdNode *bTrans,DdNode *bInitial,int fVerbose)

{
  FILE *__stream;
  int iVar1;
  int iStop;
  DdNode *n;
  DdNode *pDVar2;
  DdNode *n_00;
  double dVar3;
  uint local_64;
  int nMints;
  int nIters;
  DdNode *bTemp;
  DdNode *bNext;
  DdNode *bCurrent;
  DdNode *bCubeCs;
  DdNode *bReached;
  DdNode *bRelation;
  int fVerbose_local;
  DdNode *bInitial_local;
  DdNode *bTrans_local;
  Abc_Ntk_t *pNtk_local;
  DdManager *dd_local;
  
  Cudd_Ref(bInitial);
  Cudd_Ref(bInitial);
  Cudd_Ref(bTrans);
  iVar1 = Abc_NtkPiNum(pNtk);
  iStop = Abc_NtkCiNum(pNtk);
  n = Extra_bddComputeRangeCube(dd,iVar1,iStop);
  Cudd_Ref(n);
  local_64 = 1;
  bNext = bInitial;
  bCubeCs = bInitial;
  while( true ) {
    pDVar2 = Cudd_bddAndAbstract(dd,bTrans,bNext,n);
    Cudd_Ref(pDVar2);
    Cudd_RecursiveDeref(dd,bNext);
    n_00 = Cudd_bddVarMap(dd,pDVar2);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(dd,pDVar2);
    iVar1 = Cudd_bddLeq(dd,n_00,bCubeCs);
    if (iVar1 != 0) break;
    bNext = Cudd_bddAnd(dd,n_00,(DdNode *)((ulong)bCubeCs ^ 1));
    Cudd_Ref(bNext);
    pDVar2 = Cudd_bddOr(dd,bCubeCs,n_00);
    Cudd_Ref(pDVar2);
    Cudd_RecursiveDeref(dd,bCubeCs);
    Cudd_RecursiveDeref(dd,n_00);
    local_64 = local_64 + 1;
    bCubeCs = pDVar2;
  }
  Cudd_RecursiveDeref(dd,bTrans);
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,n_00);
  if (fVerbose != 0) {
    iVar1 = Abc_NtkLatchNum(pNtk);
    dVar3 = Cudd_CountMinterm(dd,bCubeCs,iVar1);
    fprintf(_stdout,"Reachability analysis completed in %d iterations.\n",(ulong)local_64);
    __stream = _stdout;
    iVar1 = Abc_NtkLatchNum(pNtk);
    fprintf(__stream,"The number of minterms in the reachable state set = %d. (%6.2f %%)\n",
            ((double)(int)dVar3 * 100.0) / (double)(1 << ((byte)iVar1 & 0x1f)),
            (ulong)(uint)(int)dVar3);
  }
  Cudd_Deref(bCubeCs);
  return (DdNode *)((ulong)bCubeCs ^ 1);
}

Assistant:

DdNode * Abc_NtkComputeUnreachable( DdManager * dd, Abc_Ntk_t * pNtk, DdNode * bTrans, DdNode * bInitial, int fVerbose )
{
    DdNode * bRelation, * bReached, * bCubeCs;
    DdNode * bCurrent, * bNext, * bTemp;
    int nIters, nMints;

    // perform reachability analisys
    bCurrent  = bInitial;   Cudd_Ref( bCurrent );
    bReached  = bInitial;   Cudd_Ref( bReached );
    bRelation = bTrans;     Cudd_Ref( bRelation );
    bCubeCs   = Extra_bddComputeRangeCube( dd, Abc_NtkPiNum(pNtk), Abc_NtkCiNum(pNtk) );    Cudd_Ref( bCubeCs );
    for ( nIters = 1; ; nIters++ )
    {
        // compute the next states
        bNext = Cudd_bddAndAbstract( dd, bRelation, bCurrent, bCubeCs );  Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bCurrent );
        // remap these states into the current state vars
        bNext = Cudd_bddVarMap( dd, bTemp = bNext );                      Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bTemp );
        // check if there are any new states
        if ( Cudd_bddLeq( dd, bNext, bReached ) )
            break;
        // get the new states
        bCurrent = Cudd_bddAnd( dd, bNext, Cudd_Not(bReached) );          Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( dd, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( dd, bTemp );
        // add to the reached states
        bReached = Cudd_bddOr( dd, bTemp = bReached, bNext );             Cudd_Ref( bReached );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bNext );
        // minimize the transition relation
//        bRelation = Cudd_bddConstrain( dd, bTemp = bRelation, Cudd_Not(bReached) ); Cudd_Ref( bRelation );
//        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_RecursiveDeref( dd, bRelation );
    Cudd_RecursiveDeref( dd, bCubeCs );
    Cudd_RecursiveDeref( dd, bNext );
    // report the stats
    if ( fVerbose )
    {
        nMints = (int)Cudd_CountMinterm(dd, bReached, Abc_NtkLatchNum(pNtk) );
        fprintf( stdout, "Reachability analysis completed in %d iterations.\n", nIters );
        fprintf( stdout, "The number of minterms in the reachable state set = %d. (%6.2f %%)\n", nMints, 100.0*nMints/(1<<Abc_NtkLatchNum(pNtk)) );
    }
//ABC_PRB( dd, bReached );
    Cudd_Deref( bReached );
    return Cudd_Not( bReached );
}